

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O0

int cJSONUtils_ApplyPatches(cJSON *object,cJSON *patches)

{
  int iVar1;
  cJSON *pcStack_28;
  int status;
  cJSON *current_patch;
  cJSON *patches_local;
  cJSON *object_local;
  
  pcStack_28 = (cJSON *)0x0;
  iVar1 = cJSON_IsArray(patches);
  if (iVar1 == 0) {
    object_local._4_4_ = 1;
  }
  else {
    if (patches != (cJSON *)0x0) {
      pcStack_28 = patches->child;
    }
    for (; pcStack_28 != (cJSON *)0x0; pcStack_28 = pcStack_28->next) {
      iVar1 = apply_patch(object,pcStack_28,0);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    object_local._4_4_ = 0;
  }
  return object_local._4_4_;
}

Assistant:

CJSON_PUBLIC(int) cJSONUtils_ApplyPatches(cJSON * const object, const cJSON * const patches)
{
    const cJSON *current_patch = NULL;
    int status = 0;

    if (!cJSON_IsArray(patches))
    {
        /* malformed patches. */
        return 1;
    }

    if (patches != NULL)
    {
        current_patch = patches->child;
    }

    while (current_patch != NULL)
    {
        status = apply_patch(object, current_patch, false);
        if (status != 0)
        {
            return status;
        }
        current_patch = current_patch->next;
    }

    return 0;
}